

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::RangeCoverageBinInitializerSyntax::setChild
          (RangeCoverageBinInitializerSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar1;
  WithClauseSyntax *pWVar2;
  RangeListSyntax *pRVar3;
  
  ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                      ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child);
  if (index == 0) {
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pRVar3 = (RangeListSyntax *)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pRVar3 = (RangeListSyntax *)*ppSVar1;
    }
    (this->ranges).ptr = pRVar3;
  }
  else {
    if (*ppSVar1 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pWVar2 = (WithClauseSyntax *)0x0;
    }
    else {
      ppSVar1 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pWVar2 = (WithClauseSyntax *)*ppSVar1;
    }
    this->withClause = pWVar2;
  }
  return;
}

Assistant:

void RangeCoverageBinInitializerSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: ranges = child.node() ? &child.node()->as<RangeListSyntax>() : nullptr; return;
        case 1: withClause = child.node() ? &child.node()->as<WithClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}